

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

void __thiscall
QLayoutPrivate::getMargin(QLayoutPrivate *this,int *result,int userMargin,PixelMetric pm)

{
  QWidget *this_00;
  QStyle *pQVar1;
  
  if (result != (int *)0x0) {
    if ((userMargin < 0) && (userMargin = 0, (this->field_0x8c & 1) != 0)) {
      this_00 = QLayout::parentWidget(*(QLayout **)&this->field_0x8);
      if (this_00 != (QWidget *)0x0) {
        pQVar1 = QWidget::style(this_00);
        userMargin = (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,pm,0,this_00);
      }
    }
    *result = userMargin;
  }
  return;
}

Assistant:

void QLayoutPrivate::getMargin(int *result, int userMargin, QStyle::PixelMetric pm) const
{
    if (!result)
        return;

    Q_Q(const QLayout);
    if (userMargin >= 0) {
        *result = userMargin;
    } else if (!topLevel) {
        *result = 0;
    } else if (QWidget *pw = q->parentWidget()) {
        *result = pw->style()->pixelMetric(pm, nullptr, pw);
    } else {
        *result = 0;
    }
}